

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_stage7_high48_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i alVar34;
  undefined1 auVar35 [16];
  __m128i alVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  alVar34 = x[0x12];
  alVar36 = x[0x13];
  alVar1 = x[0x14];
  alVar2 = x[0x15];
  auVar31._0_12_ = alVar34._0_12_;
  auVar31._12_2_ = alVar34[0]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)x[0x1d] + 6);
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = alVar34._0_10_;
  auVar30._10_2_ = *(undefined2 *)((long)x[0x1d] + 4);
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_8_ = alVar34[0];
  auVar29._8_2_ = alVar34[0]._4_2_;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._6_2_ = *(undefined2 *)((long)x[0x1d] + 2);
  auVar28._4_2_ = alVar34[0]._2_2_;
  auVar28._0_2_ = (undefined2)alVar34[0];
  auVar28._2_2_ = (short)x[0x1d][0];
  auVar19._2_2_ = (short)x[0x1d][1];
  auVar19._0_2_ = (short)alVar34[1];
  auVar19._4_2_ = alVar34[1]._2_2_;
  auVar19._6_2_ = *(undefined2 *)((long)x[0x1d] + 10);
  auVar19._8_2_ = alVar34[1]._4_2_;
  auVar19._10_2_ = *(undefined2 *)((long)x[0x1d] + 0xc);
  auVar19._12_2_ = alVar34[1]._6_2_;
  auVar19._14_2_ = *(undefined2 *)((long)x[0x1d] + 0xe);
  auVar3._8_4_ = 0x61ff138;
  auVar3._0_8_ = 0x61ff138061ff138;
  auVar3._12_4_ = 0x61ff138;
  auVar39 = pmaddwd(auVar28,auVar3);
  auVar43 = pmaddwd(auVar19,auVar3);
  auVar12._8_4_ = 0xec8061f;
  auVar12._0_8_ = 0xec8061f0ec8061f;
  auVar12._12_4_ = 0xec8061f;
  auVar32 = pmaddwd(auVar28,auVar12);
  auVar20 = pmaddwd(auVar19,auVar12);
  auVar40._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar40._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar40._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar40._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  auVar44._0_4_ = auVar43._0_4_ + in_XMM0_Da >> 0xc;
  auVar44._4_4_ = auVar43._4_4_ + in_XMM0_Db >> 0xc;
  auVar44._8_4_ = auVar43._8_4_ + in_XMM0_Dc >> 0xc;
  auVar44._12_4_ = auVar43._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar40,auVar44);
  auVar33._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar33._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar33._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar33._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar21._0_4_ = auVar20._0_4_ + in_XMM0_Da >> 0xc;
  auVar21._4_4_ = auVar20._4_4_ + in_XMM0_Db >> 0xc;
  auVar21._8_4_ = auVar20._8_4_ + in_XMM0_Dc >> 0xc;
  auVar21._12_4_ = auVar20._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar33,auVar21);
  x[0x12] = alVar41;
  x[0x1d] = alVar34;
  auVar25._0_12_ = alVar36._0_12_;
  auVar25._12_2_ = alVar36[0]._6_2_;
  auVar25._14_2_ = *(undefined2 *)((long)x[0x1c] + 6);
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = alVar36._0_10_;
  auVar24._10_2_ = *(undefined2 *)((long)x[0x1c] + 4);
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = alVar36[0];
  auVar23._8_2_ = alVar36[0]._4_2_;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._6_2_ = *(undefined2 *)((long)x[0x1c] + 2);
  auVar22._4_2_ = alVar36[0]._2_2_;
  auVar22._0_2_ = (undefined2)alVar36[0];
  auVar22._2_2_ = (short)x[0x1c][0];
  auVar8._2_2_ = (short)x[0x1c][1];
  auVar8._0_2_ = (short)alVar36[1];
  auVar8._4_2_ = alVar36[1]._2_2_;
  auVar8._6_2_ = *(undefined2 *)((long)x[0x1c] + 10);
  auVar8._8_2_ = alVar36[1]._4_2_;
  auVar8._10_2_ = *(undefined2 *)((long)x[0x1c] + 0xc);
  auVar8._12_2_ = alVar36[1]._6_2_;
  auVar8._14_2_ = *(undefined2 *)((long)x[0x1c] + 0xe);
  auVar39 = pmaddwd(auVar22,auVar3);
  auVar43 = pmaddwd(auVar8,auVar3);
  auVar32 = pmaddwd(auVar22,auVar12);
  auVar20 = pmaddwd(auVar8,auVar12);
  auVar35._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar35._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar35._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar35._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  auVar42._0_4_ = auVar43._0_4_ + in_XMM0_Da >> 0xc;
  auVar42._4_4_ = auVar43._4_4_ + in_XMM0_Db >> 0xc;
  auVar42._8_4_ = auVar43._8_4_ + in_XMM0_Dc >> 0xc;
  auVar42._12_4_ = auVar43._12_4_ + in_XMM0_Dd >> 0xc;
  alVar36 = (__m128i)packssdw(auVar35,auVar42);
  auVar26._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar26._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar26._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar26._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar9._0_4_ = auVar20._0_4_ + in_XMM0_Da >> 0xc;
  auVar9._4_4_ = auVar20._4_4_ + in_XMM0_Db >> 0xc;
  auVar9._8_4_ = auVar20._8_4_ + in_XMM0_Dc >> 0xc;
  auVar9._12_4_ = auVar20._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar26,auVar9);
  x[0x13] = alVar36;
  x[0x1c] = alVar34;
  auVar16._0_12_ = alVar1._0_12_;
  auVar16._12_2_ = alVar1[0]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)x[0x1b] + 6);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar1._0_10_;
  auVar15._10_2_ = *(undefined2 *)((long)x[0x1b] + 4);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar1[0];
  auVar14._8_2_ = alVar1[0]._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = *(undefined2 *)((long)x[0x1b] + 2);
  auVar13._4_2_ = alVar1[0]._2_2_;
  auVar13._0_2_ = (undefined2)alVar1[0];
  auVar13._2_2_ = (short)x[0x1b][0];
  auVar39._2_2_ = (short)x[0x1b][1];
  auVar39._0_2_ = (short)alVar1[1];
  auVar39._4_2_ = alVar1[1]._2_2_;
  auVar39._6_2_ = *(undefined2 *)((long)x[0x1b] + 10);
  auVar39._8_2_ = alVar1[1]._4_2_;
  auVar39._10_2_ = *(undefined2 *)((long)x[0x1b] + 0xc);
  auVar39._12_2_ = alVar1[1]._6_2_;
  auVar39._14_2_ = *(undefined2 *)((long)x[0x1b] + 0xe);
  auVar10._8_4_ = 0xf138f9e1;
  auVar10._0_8_ = 0xf138f9e1f138f9e1;
  auVar10._12_4_ = 0xf138f9e1;
  auVar43 = pmaddwd(auVar13,auVar10);
  auVar37 = pmaddwd(auVar39,auVar10);
  auVar32 = pmaddwd(auVar13,auVar3);
  auVar20 = pmaddwd(auVar39,auVar3);
  auVar27._0_4_ = auVar43._0_4_ + in_XMM0_Da >> 0xc;
  auVar27._4_4_ = auVar43._4_4_ + in_XMM0_Db >> 0xc;
  auVar27._8_4_ = auVar43._8_4_ + in_XMM0_Dc >> 0xc;
  auVar27._12_4_ = auVar43._12_4_ + in_XMM0_Dd >> 0xc;
  auVar38._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  alVar36 = (__m128i)packssdw(auVar27,auVar38);
  auVar17._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar17._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar17._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar17._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar43._0_4_ = auVar20._0_4_ + in_XMM0_Da >> 0xc;
  auVar43._4_4_ = auVar20._4_4_ + in_XMM0_Db >> 0xc;
  auVar43._8_4_ = auVar20._8_4_ + in_XMM0_Dc >> 0xc;
  auVar43._12_4_ = auVar20._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar17,auVar43);
  x[0x14] = alVar36;
  x[0x1b] = alVar34;
  auVar6._0_12_ = alVar2._0_12_;
  auVar6._12_2_ = alVar2[0]._6_2_;
  auVar6._14_2_ = *(undefined2 *)((long)x[0x1a] + 6);
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._0_10_ = alVar2._0_10_;
  auVar5._10_2_ = *(undefined2 *)((long)x[0x1a] + 4);
  auVar4._10_6_ = auVar5._10_6_;
  auVar4._0_8_ = alVar2[0];
  auVar4._8_2_ = alVar2[0]._4_2_;
  auVar37._8_8_ = auVar4._8_8_;
  auVar37._6_2_ = *(undefined2 *)((long)x[0x1a] + 2);
  auVar37._4_2_ = alVar2[0]._2_2_;
  auVar37._0_2_ = (undefined2)alVar2[0];
  auVar37._2_2_ = (short)x[0x1a][0];
  auVar20._2_2_ = (short)x[0x1a][1];
  auVar20._0_2_ = (short)alVar2[1];
  auVar20._4_2_ = alVar2[1]._2_2_;
  auVar20._6_2_ = *(undefined2 *)((long)x[0x1a] + 10);
  auVar20._8_2_ = alVar2[1]._4_2_;
  auVar20._10_2_ = *(undefined2 *)((long)x[0x1a] + 0xc);
  auVar20._12_2_ = alVar2[1]._6_2_;
  auVar20._14_2_ = *(undefined2 *)((long)x[0x1a] + 0xe);
  auVar43 = pmaddwd(auVar37,auVar10);
  auVar39 = pmaddwd(auVar10,auVar20);
  auVar32 = pmaddwd(auVar37,auVar3);
  auVar20 = pmaddwd(auVar20,auVar3);
  auVar18._0_4_ = auVar43._0_4_ + in_XMM0_Da >> 0xc;
  auVar18._4_4_ = auVar43._4_4_ + in_XMM0_Db >> 0xc;
  auVar18._8_4_ = auVar43._8_4_ + in_XMM0_Dc >> 0xc;
  auVar18._12_4_ = auVar43._12_4_ + in_XMM0_Dd >> 0xc;
  auVar11._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar11._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar11._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar11._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  alVar36 = (__m128i)packssdw(auVar18,auVar11);
  auVar7._0_4_ = auVar32._0_4_ + in_XMM0_Da >> 0xc;
  auVar7._4_4_ = auVar32._4_4_ + in_XMM0_Db >> 0xc;
  auVar7._8_4_ = auVar32._8_4_ + in_XMM0_Dc >> 0xc;
  auVar7._12_4_ = auVar32._12_4_ + in_XMM0_Dd >> 0xc;
  auVar32._0_4_ = auVar20._0_4_ + in_XMM0_Da >> 0xc;
  auVar32._4_4_ = auVar20._4_4_ + in_XMM0_Db >> 0xc;
  auVar32._8_4_ = auVar20._8_4_ + in_XMM0_Dc >> 0xc;
  auVar32._12_4_ = auVar20._12_4_ + in_XMM0_Dd >> 0xc;
  alVar34 = (__m128i)packssdw(auVar7,auVar32);
  x[0x15] = alVar36;
  x[0x1a] = alVar34;
  alVar34 = x[0x20];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x27]);
  x[0x20] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x27]);
  x[0x27] = alVar34;
  alVar34 = x[0x21];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x26]);
  x[0x21] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x26]);
  x[0x26] = alVar34;
  alVar34 = x[0x22];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x25]);
  x[0x22] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x25]);
  x[0x25] = alVar34;
  alVar34 = x[0x23];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x24]);
  x[0x23] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x24]);
  x[0x24] = alVar34;
  alVar34 = x[0x28];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x2f],(undefined1  [16])alVar34);
  x[0x28] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x2f],(undefined1  [16])alVar34);
  x[0x2f] = alVar34;
  alVar34 = x[0x29];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x2e],(undefined1  [16])alVar34);
  x[0x29] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x2e],(undefined1  [16])alVar34);
  x[0x2e] = alVar34;
  alVar34 = x[0x2a];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x2d],(undefined1  [16])alVar34);
  x[0x2a] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x2d],(undefined1  [16])alVar34);
  x[0x2d] = alVar34;
  alVar34 = x[0x2b];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x2c],(undefined1  [16])alVar34);
  x[0x2b] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x2c],(undefined1  [16])alVar34);
  x[0x2c] = alVar34;
  alVar34 = x[0x30];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x37]);
  x[0x30] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x37]);
  x[0x37] = alVar34;
  alVar34 = x[0x31];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x36]);
  x[0x31] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x36]);
  x[0x36] = alVar34;
  alVar34 = x[0x32];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x35]);
  x[0x32] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x35]);
  x[0x35] = alVar34;
  alVar34 = x[0x33];
  alVar36 = (__m128i)paddsw((undefined1  [16])alVar34,(undefined1  [16])x[0x34]);
  x[0x33] = alVar36;
  alVar34 = (__m128i)psubsw((undefined1  [16])alVar34,(undefined1  [16])x[0x34]);
  x[0x34] = alVar34;
  alVar34 = x[0x38];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x3f],(undefined1  [16])alVar34);
  x[0x38] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x3f],(undefined1  [16])alVar34);
  x[0x3f] = alVar34;
  alVar34 = x[0x39];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x3e],(undefined1  [16])alVar34);
  x[0x39] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x3e],(undefined1  [16])alVar34);
  x[0x3e] = alVar34;
  alVar34 = x[0x3a];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x3d],(undefined1  [16])alVar34);
  x[0x3a] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x3d],(undefined1  [16])alVar34);
  x[0x3d] = alVar34;
  alVar34 = x[0x3b];
  alVar36 = (__m128i)psubsw((undefined1  [16])x[0x3c],(undefined1  [16])alVar34);
  x[0x3b] = alVar36;
  alVar34 = (__m128i)paddsw((undefined1  [16])x[0x3c],(undefined1  [16])alVar34);
  x[0x3c] = alVar34;
  return;
}

Assistant:

static inline void idct64_stage7_high48_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[19], x[28], x[19], x[28]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[21], x[26], x[21], x[26]);
  btf_16_adds_subs_sse2(x[32], x[39]);
  btf_16_adds_subs_sse2(x[33], x[38]);
  btf_16_adds_subs_sse2(x[34], x[37]);
  btf_16_adds_subs_sse2(x[35], x[36]);
  btf_16_subs_adds_sse2(x[47], x[40]);
  btf_16_subs_adds_sse2(x[46], x[41]);
  btf_16_subs_adds_sse2(x[45], x[42]);
  btf_16_subs_adds_sse2(x[44], x[43]);
  btf_16_adds_subs_sse2(x[48], x[55]);
  btf_16_adds_subs_sse2(x[49], x[54]);
  btf_16_adds_subs_sse2(x[50], x[53]);
  btf_16_adds_subs_sse2(x[51], x[52]);
  btf_16_subs_adds_sse2(x[63], x[56]);
  btf_16_subs_adds_sse2(x[62], x[57]);
  btf_16_subs_adds_sse2(x[61], x[58]);
  btf_16_subs_adds_sse2(x[60], x[59]);
}